

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

Boxed_Value __thiscall chaiscript::ChaiScript_Basic::use(ChaiScript_Basic *this,string *t_filename)

{
  bool bVar1;
  reference __lhs;
  size_type sVar2;
  file_not_found_error *this_00;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  file_not_found_error *e;
  shared_ptr<chaiscript::detail::Exception_Handler_Base> local_b8;
  undefined1 local_a8 [32];
  unique_lock<chaiscript::detail::threading::shared_mutex> l2;
  undefined1 local_70 [8];
  unique_lock<chaiscript::detail::threading::recursive_mutex> l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> appendedpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *t_filename_local;
  ChaiScript_Basic *this_local;
  Boxed_Value *retval;
  
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&t_filename[8].field_2);
  path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&t_filename[8].field_2);
  bVar1 = __gnu_cxx::
          operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&path);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    __lhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l._M_owns,
                   __lhs,in_RDX);
    std::unique_lock<std::recursive_mutex>::unique_lock
              ((unique_lock<std::recursive_mutex> *)local_70,(mutex_type *)(t_filename + 2));
    std::unique_lock<std::shared_mutex>::unique_lock
              ((unique_lock<std::shared_mutex> *)(local_a8 + 0x18),
               (mutex_type *)&t_filename->_M_string_length);
    local_a8[0x17] = '\0';
    Boxed_Value::Boxed_Value((Boxed_Value *)this);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&t_filename[3]._M_string_length,(key_type *)&l._M_owns);
    if (sVar2 == 0) {
      std::unique_lock<std::shared_mutex>::unlock
                ((unique_lock<std::shared_mutex> *)(local_a8 + 0x18));
      std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr(&local_b8);
      eval_file((ChaiScript_Basic *)local_a8,t_filename,(Exception_Handler *)&l._M_owns);
      Boxed_Value::operator=((Boxed_Value *)this,(Boxed_Value *)local_a8);
      Boxed_Value::~Boxed_Value((Boxed_Value *)local_a8);
      std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr(&local_b8);
      std::unique_lock<std::shared_mutex>::lock((unique_lock<std::shared_mutex> *)(local_a8 + 0x18))
      ;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&t_filename[3]._M_string_length,(value_type *)&l._M_owns);
    }
    local_a8[0x17] = '\x01';
    std::unique_lock<std::shared_mutex>::~unique_lock
              ((unique_lock<std::shared_mutex> *)(local_a8 + 0x18));
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_70);
    std::__cxx11::string::~string((string *)&l._M_owns);
    BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar3.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (file_not_found_error *)__cxa_allocate_exception(0x30);
  exception::file_not_found_error::file_not_found_error(this_00,in_RDX);
  __cxa_throw(this_00,&exception::file_not_found_error::typeinfo,
              exception::file_not_found_error::~file_not_found_error);
}

Assistant:

Boxed_Value use(const std::string &t_filename) {
      for (const auto &path : m_use_paths) {
        const auto appendedpath = path + t_filename;
        try {
          chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);
          chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l2(m_mutex);

          Boxed_Value retval;

          if (m_used_files.count(appendedpath) == 0) {
            l2.unlock();
            retval = eval_file(appendedpath);
            l2.lock();
            m_used_files.insert(appendedpath);
          }

          return retval; // return, we loaded it, or it was already loaded
        } catch (const exception::file_not_found_error &e) {
          if (e.filename != appendedpath) {
            // a nested file include failed
            throw;
          }
          // failed to load, try the next path
        }
      }

      // failed to load by any name
      throw exception::file_not_found_error(t_filename);
    }